

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<long_long,long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,
                bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  long lVar2;
  longlong lVar3;
  long lVar4;
  longlong lVar5;
  double dVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar7 = 0.0;
  lVar2 = v_max - v_min;
  if (lVar2 != 0) {
    lVar5 = v_max;
    if (lVar2 != 0 && v_min <= v_max) {
      lVar5 = v_min;
    }
    lVar4 = v_max;
    if (v_max < v_min) {
      lVar4 = v_min;
    }
    if (v < lVar4) {
      lVar4 = v;
    }
    if (v < lVar5) {
      lVar4 = lVar5;
    }
    if (is_logarithmic) {
      lVar5 = v_min;
      if (v_max < v_min) {
        lVar5 = v_max;
      }
      lVar3 = v_min;
      if (v_min < v_max) {
        lVar3 = v_max;
      }
      auVar10._0_8_ = (double)lVar5;
      auVar10._8_8_ = in_XMM3_Qa;
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar1 = vandpd_avx(auVar10,auVar8);
      dVar9 = (double)logarithmic_zero_epsilon;
      if (auVar1._0_8_ < dVar9) {
        fVar7 = logarithmic_zero_epsilon;
        if (lVar5 < 0) {
          fVar7 = -logarithmic_zero_epsilon;
        }
        auVar10._0_8_ = (double)fVar7;
      }
      auVar11._0_8_ = (double)lVar3;
      auVar11._8_8_ = in_XMM4_Qa;
      auVar1 = vandpd_avx(auVar11,auVar8);
      if (auVar1._0_8_ < dVar9) {
        fVar7 = logarithmic_zero_epsilon;
        if (lVar3 < 0) {
          fVar7 = -logarithmic_zero_epsilon;
        }
        auVar11._0_8_ = (double)fVar7;
      }
      if (lVar3 < 0 && lVar5 == 0) {
        auVar10._0_8_ = (double)-logarithmic_zero_epsilon;
      }
      else if (lVar5 < 0 && lVar3 == 0) {
        auVar11._0_8_ = (double)-logarithmic_zero_epsilon;
      }
      dVar6 = (double)lVar4;
      fVar7 = 0.0;
      if (auVar10._0_8_ < dVar6) {
        if (auVar11._0_8_ <= dVar6) {
          fVar7 = 1.0;
        }
        else if (v_max * v_min < 0) {
          fVar7 = -(float)lVar5 / ((float)lVar3 - (float)lVar5);
          if (v != 0) {
            if (v < 0) {
              auVar11._0_8_ = log(-dVar6 / dVar9);
              dVar9 = log(-auVar10._0_8_ / dVar9);
              fVar7 = (1.0 - (float)(auVar11._0_8_ / dVar9)) * (fVar7 - zero_deadzone_halfsize);
            }
            else {
              auVar10._0_8_ = log(dVar6 / dVar9);
              dVar9 = log(auVar11._0_8_ / dVar9);
              fVar7 = (float)(auVar10._0_8_ / dVar9) * (1.0 - (fVar7 + zero_deadzone_halfsize)) +
                      fVar7 + zero_deadzone_halfsize;
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          dVar9 = log(dVar6 / auVar11._0_8_);
          auVar10._0_8_ = log(auVar10._0_8_ / auVar11._0_8_);
          fVar7 = 1.0 - (float)(dVar9 / auVar10._0_8_);
        }
        else {
          dVar9 = log(dVar6 / auVar10._0_8_);
          auVar10._0_8_ = log(auVar11._0_8_ / auVar10._0_8_);
          fVar7 = (float)(dVar9 / auVar10._0_8_);
        }
      }
      if (v_max < v_min) {
        fVar7 = 1.0 - fVar7;
      }
    }
    else {
      fVar7 = (float)((double)(lVar4 - v_min) / (double)lVar2);
    }
  }
  return fVar7;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}